

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *dest;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  void **ppvVar16;
  bool bVar17;
  char syntax [200];
  char local_10b [3];
  char *local_108;
  char *local_100;
  char local_f8 [198];
  char local_32 [2];
  
  pbVar5 = (byte *)*argtable;
  pcVar12 = "";
  local_108 = suffix;
  if (pbVar5 != (byte *)0x0) {
    ppvVar16 = argtable + 1;
    pcVar4 = " -%c";
    pcVar14 = " [-%c";
    do {
      if ((*pbVar5 & 1) != 0) break;
      if ((0 < *(int *)(pbVar5 + 0x28)) &&
         ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar4,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
        pcVar4 = "%c";
        pcVar14 = "[%c";
      }
      pbVar5 = (byte *)*ppvVar16;
      ppvVar16 = ppvVar16 + 1;
    } while (pbVar5 != (byte *)0x0);
    pbVar5 = (byte *)*argtable;
    if (pbVar5 != (byte *)0x0) {
      ppvVar16 = argtable + 1;
      pcVar12 = "";
      do {
        if ((*pbVar5 & 1) != 0) break;
        if ((*(int *)(pbVar5 + 0x28) < 1) &&
           ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
          arg_dstr_catf(ds,pcVar14,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
          pcVar14 = "%c";
          pcVar12 = "]";
        }
        pbVar5 = (byte *)*ppvVar16;
        ppvVar16 = ppvVar16 + 1;
      } while (pbVar5 != (byte *)0x0);
    }
  }
  arg_dstr_catf(ds,"%s",pcVar12);
  pbVar5 = (byte *)*argtable;
  if (pbVar5 == (byte *)0x0) {
LAB_0010e9d7:
    if (local_108 != (char *)0x0) {
      arg_dstr_cat(ds,local_108);
    }
    return;
  }
  lVar13 = 0;
LAB_0010e3fa:
  if ((*pbVar5 & 1) == 0) {
    memset(local_f8,0,200);
    if (*(undefined1 **)(pbVar5 + 8) == (undefined1 *)0x0) {
      pcVar12 = *(char **)(pbVar5 + 0x10);
      pcVar4 = *(char **)(pbVar5 + 0x18);
      bVar1 = *pbVar5;
      if (pcVar12 != (char *)0x0) {
        uVar6 = 0;
        pcVar14 = local_f8;
        local_100 = pcVar4;
        do {
          if (local_f8[uVar6] == '\0') {
            if (0xc5 < uVar6) {
              pcVar14 = local_f8 + uVar6;
              goto LAB_0010e696;
            }
            lVar10 = -1;
            goto LAB_0010e597;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0xc6);
        pcVar14 = local_32;
        goto LAB_0010e696;
      }
      if (pcVar4 != (char *)0x0) {
        if ((bVar1 & 4) == 0) {
          uVar6 = 0;
          pcVar12 = local_32;
          do {
            if (local_f8[uVar6] == '\0') {
              if (0xc5 < uVar6) goto LAB_0010e8cc;
              goto LAB_0010e841;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != 0xc6);
          goto LAB_0010e8d3;
        }
        pcVar12 = local_f8;
        uVar6 = 0;
        do {
          if (*pcVar12 == '\0') {
            pcVar8 = pcVar12;
            if (uVar6 < 0xc6) {
              *pcVar12 = '[';
              pcVar8 = pcVar12 + 1;
            }
            break;
          }
          uVar6 = uVar6 + 1;
          pcVar12 = pcVar12 + 1;
          pcVar8 = local_32;
        } while (uVar6 != 0xc6);
        *pcVar8 = '\0';
        pcVar14 = local_32;
        pcVar12 = pcVar8;
        if (pcVar8 < pcVar14) {
          do {
            if (*pcVar8 == '\0') goto LAB_0010e8a1;
            pcVar8 = pcVar8 + 1;
            pcVar12 = pcVar12 + 1;
            pcVar7 = pcVar14;
          } while (local_32 != pcVar12);
        }
        else {
LAB_0010e8a1:
          pcVar7 = pcVar8;
          if (pcVar8 < pcVar14) {
            lVar10 = (long)local_32 - (long)pcVar12;
            lVar15 = 0;
            do {
              if (pcVar4[lVar15] == '\0') {
                pcVar7 = pcVar8 + lVar15;
                break;
              }
              pcVar8[lVar15] = pcVar4[lVar15];
              lVar15 = lVar15 + 1;
              pcVar7 = pcVar8 + lVar10;
            } while (lVar10 != lVar15);
          }
        }
        *pcVar7 = '\0';
        if (pcVar14 <= pcVar7) goto LAB_0010e8f8;
        lVar10 = (long)local_32 - (long)pcVar7;
        do {
          if (*pcVar7 == '\0') goto LAB_0010e8f8;
          pcVar7 = pcVar7 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        goto LAB_0010e906;
      }
      goto LAB_0010e909;
    }
    bVar1 = *pbVar5;
    if ((bVar1 & 2) != 0) {
      lVar10 = *(long *)(pbVar5 + 0x18);
      local_10b[0] = '-';
      local_10b[1] = **(undefined1 **)(pbVar5 + 8);
      local_10b[2] = 0;
      uVar6 = 0;
      do {
        pcVar12 = local_32;
        if (local_f8[uVar6] == '\0') {
          if (0xc5 < uVar6) goto LAB_0010e518;
          pcVar4 = local_10b;
          goto LAB_0010e4bc;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0xc6);
      goto LAB_0010e51f;
    }
    goto LAB_0010e9c6;
  }
  goto LAB_0010e9d7;
  while( true ) {
    pcVar14[uVar6] = "--"[lVar10 + 1];
    lVar15 = uVar6 + lVar10;
    lVar10 = lVar10 + 1;
    pcVar14 = pcVar14 + 1;
    if (0xc4 < lVar15 + 1U) break;
LAB_0010e597:
    if (lVar10 == 1) break;
  }
  pcVar14 = pcVar14 + uVar6;
LAB_0010e696:
  *pcVar14 = '\0';
  pcVar7 = local_32 + (1 - (long)pcVar14);
  pcVar4 = (char *)strcspn(pcVar12,",");
  if (pcVar7 <= pcVar4) {
    pcVar4 = pcVar7;
  }
  strncat(pcVar14,pcVar12,(size_t)pcVar4);
  if (local_100 != (char *)0x0) {
    pcVar12 = pcVar14 + (long)(pcVar7 + -1);
    if (pcVar14 < pcVar12) {
      pcVar4 = local_32 + -(long)pcVar14;
      do {
        if (*pcVar14 == '\0') goto LAB_0010e704;
        pcVar14 = pcVar14 + 1;
        pcVar4 = pcVar4 + -1;
      } while (pcVar4 != (char *)0x0);
    }
    else {
LAB_0010e704:
      bVar17 = pcVar14 < pcVar12;
      pcVar12 = pcVar14;
      if (bVar17) {
        *pcVar14 = '=';
        pcVar12 = pcVar14 + 1;
      }
    }
    *pcVar12 = '\0';
    pcVar14 = local_32;
    if ((bVar1 & 4) == 0) {
      pcVar4 = pcVar12;
      if (pcVar12 < local_32) {
        do {
          if (*pcVar12 == '\0') goto LAB_0010e769;
          pcVar12 = pcVar12 + 1;
          pcVar4 = pcVar4 + 1;
        } while (local_32 != pcVar4);
      }
      else {
LAB_0010e769:
        pcVar14 = pcVar12;
        if (pcVar12 < local_32) {
          lVar10 = 0;
          do {
            if (local_100[lVar10] == '\0') break;
            pcVar12[lVar10] = local_100[lVar10];
            lVar10 = lVar10 + 1;
          } while ((long)local_32 - (long)pcVar4 != lVar10);
          pcVar14 = pcVar12 + lVar10;
        }
      }
    }
    else {
      if (pcVar12 < local_32) {
        lVar10 = (long)local_32 - (long)pcVar12;
        do {
          if (*pcVar12 == '\0') goto LAB_0010e795;
          pcVar12 = pcVar12 + 1;
          lVar10 = lVar10 + -1;
          pcVar4 = local_32;
        } while (lVar10 != 0);
      }
      else {
LAB_0010e795:
        pcVar4 = pcVar12;
        if (pcVar12 < local_32) {
          *pcVar12 = '[';
          pcVar4 = pcVar12 + 1;
        }
      }
      *pcVar4 = '\0';
      pcVar12 = pcVar4;
      if (pcVar4 < local_32) {
        do {
          if (*pcVar4 == '\0') goto LAB_0010e7c0;
          pcVar4 = pcVar4 + 1;
          pcVar12 = pcVar12 + 1;
          pcVar7 = local_32;
        } while (local_32 != pcVar12);
      }
      else {
LAB_0010e7c0:
        pcVar7 = pcVar4;
        if (pcVar4 < local_32) {
          lVar10 = 0;
          do {
            if (local_100[lVar10] == '\0') break;
            pcVar4[lVar10] = local_100[lVar10];
            lVar10 = lVar10 + 1;
          } while ((long)local_32 - (long)pcVar12 != lVar10);
          pcVar7 = pcVar4 + lVar10;
        }
      }
      *pcVar7 = '\0';
      if (pcVar7 < local_32) {
        lVar10 = (long)local_32 - (long)pcVar7;
        do {
          if (*pcVar7 == '\0') goto LAB_0010e8f8;
          pcVar7 = pcVar7 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      else {
LAB_0010e8f8:
        pcVar14 = pcVar7;
        if (pcVar7 < local_32) {
          *pcVar7 = ']';
          pcVar14 = pcVar7 + 1;
        }
      }
    }
LAB_0010e906:
    *pcVar14 = '\0';
  }
  goto LAB_0010e909;
  while( true ) {
    pcVar4 = pcVar4 + 1;
    local_f8[uVar6] = cVar2;
    bVar17 = 0xc4 < uVar6;
    uVar6 = uVar6 + 1;
    if (bVar17) break;
LAB_0010e841:
    cVar2 = *pcVar4;
    if (cVar2 == '\0') goto LAB_0010e8cc;
  }
LAB_0010e8d3:
  *pcVar12 = '\0';
  goto LAB_0010e909;
LAB_0010e8cc:
  pcVar12 = local_f8 + uVar6;
  goto LAB_0010e8d3;
  while( true ) {
    pcVar4 = pcVar4 + 1;
    local_f8[uVar6] = cVar2;
    bVar17 = 0xc4 < uVar6;
    uVar6 = uVar6 + 1;
    if (bVar17) break;
LAB_0010e4bc:
    cVar2 = *pcVar4;
    if (cVar2 == '\0') goto LAB_0010e518;
  }
LAB_0010e51f:
  *pcVar12 = '\0';
  if (lVar10 != 0) {
    pcVar4 = local_32;
    if (pcVar12 < pcVar4) {
      lVar15 = (long)local_32 - (long)pcVar12;
      do {
        if (*pcVar12 == '\0') goto LAB_0010e553;
        pcVar12 = pcVar12 + 1;
        lVar15 = lVar15 + -1;
        pcVar14 = pcVar4;
      } while (lVar15 != 0);
    }
    else {
LAB_0010e553:
      pcVar14 = pcVar12;
      if (pcVar12 < pcVar4) {
        *pcVar12 = ' ';
        pcVar14 = pcVar12 + 1;
      }
    }
    *pcVar14 = '\0';
    if ((bVar1 & 4) == 0) {
      pcVar12 = pcVar14;
      if (pcVar14 < pcVar4) {
        do {
          if (*pcVar14 == '\0') goto LAB_0010e5e0;
          pcVar14 = pcVar14 + 1;
          pcVar12 = pcVar12 + 1;
        } while (local_32 != pcVar12);
      }
      else {
LAB_0010e5e0:
        bVar17 = pcVar14 < pcVar4;
        pcVar4 = pcVar14;
        if (bVar17) {
          lVar15 = 0;
          do {
            if (*(char *)(lVar10 + lVar15) == '\0') break;
            pcVar14[lVar15] = *(char *)(lVar10 + lVar15);
            lVar15 = lVar15 + 1;
          } while ((long)local_32 - (long)pcVar12 != lVar15);
          pcVar4 = pcVar14 + lVar15;
        }
      }
    }
    else {
      if (pcVar14 < pcVar4) {
        lVar15 = (long)local_32 - (long)pcVar14;
        do {
          if (*pcVar14 == '\0') goto LAB_0010e60b;
          pcVar14 = pcVar14 + 1;
          lVar15 = lVar15 + -1;
          pcVar12 = pcVar4;
        } while (lVar15 != 0);
      }
      else {
LAB_0010e60b:
        pcVar12 = pcVar14;
        if (pcVar14 < pcVar4) {
          *pcVar14 = '[';
          pcVar12 = pcVar14 + 1;
        }
      }
      *pcVar12 = '\0';
      pcVar14 = pcVar12;
      if (pcVar12 < pcVar4) {
        do {
          if (*pcVar12 == '\0') goto LAB_0010e636;
          pcVar12 = pcVar12 + 1;
          pcVar14 = pcVar14 + 1;
          pcVar7 = pcVar4;
        } while (local_32 != pcVar14);
      }
      else {
LAB_0010e636:
        pcVar7 = pcVar12;
        if (pcVar12 < pcVar4) {
          lVar15 = 0;
          do {
            if (*(char *)(lVar10 + lVar15) == '\0') break;
            pcVar12[lVar15] = *(char *)(lVar10 + lVar15);
            lVar15 = lVar15 + 1;
          } while ((long)local_32 - (long)pcVar14 != lVar15);
          pcVar7 = pcVar12 + lVar15;
        }
      }
      *pcVar7 = '\0';
      if (pcVar7 < pcVar4) {
        lVar10 = (long)local_32 - (long)pcVar7;
        do {
          if (*pcVar7 == '\0') goto LAB_0010e678;
          pcVar7 = pcVar7 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      else {
LAB_0010e678:
        bVar17 = pcVar7 < pcVar4;
        pcVar4 = pcVar7;
        if (bVar17) {
          *pcVar7 = ']';
          pcVar4 = pcVar7 + 1;
        }
      }
    }
    *pcVar4 = '\0';
  }
LAB_0010e909:
  if (local_f8[0] != '\0') {
    pvVar9 = argtable[lVar13];
    iVar3 = *(int *)((long)pvVar9 + 0x28);
    if (0 < iVar3) {
      iVar11 = 0;
      do {
        arg_dstr_cat(ds," ");
        arg_dstr_cat(ds,local_f8);
        iVar11 = iVar11 + 1;
        pvVar9 = argtable[lVar13];
        iVar3 = *(int *)((long)pvVar9 + 0x28);
      } while (iVar11 < iVar3);
    }
    iVar11 = *(int *)((long)pvVar9 + 0x2c) - iVar3;
    if (*(int *)((long)pvVar9 + 0x2c) != iVar3) {
      pcVar12 = "]";
      if (iVar11 != 1) {
        if (iVar11 == 2) {
          arg_dstr_cat(ds," [");
          arg_dstr_cat(ds,local_f8);
          pcVar12 = "]";
          arg_dstr_cat(ds,"]");
        }
        else {
          pcVar12 = "]...";
        }
      }
      arg_dstr_cat(ds," [");
      arg_dstr_cat(ds,local_f8);
      arg_dstr_cat(ds,pcVar12);
    }
  }
LAB_0010e9c6:
  pbVar5 = (byte *)argtable[lVar13 + 1];
  lVar13 = lVar13 + 1;
  if (pbVar5 == (byte *)0x0) goto LAB_0010e9d7;
  goto LAB_0010e3fa;
LAB_0010e518:
  pcVar12 = local_f8 + uVar6;
  goto LAB_0010e51f;
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}